

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__write(uv_stream_t *stream)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  iovec *__iovec;
  int *piVar4;
  long *plVar5;
  bool bVar6;
  size_t len;
  uv_buf_t *buf;
  int *pi;
  void *pv;
  anon_union_64_2_d657c519 scratch;
  void **ppvStack_78;
  int fd_to_send;
  cmsghdr *cmsg;
  msghdr msg;
  ssize_t n;
  int iovcnt;
  int iovmax;
  uv_write_t *req;
  QUEUE *q;
  iovec *iov;
  uv_stream_t *stream_local;
  
  do {
    while( true ) {
      if ((stream->io_watcher).fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x2f4,"void uv__write(uv_stream_t *)");
      }
      if (stream->write_queue == (void **)stream->write_queue[0]) {
        return;
      }
      pvVar1 = stream->write_queue[0];
      if (*(uv_stream_t **)((long)pvVar1 + -8) != stream) {
        __assert_fail("req->handle == stream",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x2fb,"void uv__write(uv_stream_t *)");
      }
      __iovec = (iovec *)(*(long *)((long)pvVar1 + 0x18) +
                         (ulong)*(uint *)((long)pvVar1 + 0x10) * 0x10);
      n._0_4_ = *(int *)((long)pvVar1 + 0x20) - *(int *)((long)pvVar1 + 0x10);
      iVar3 = uv__getiovmax();
      if (iVar3 < (int)n) {
        n._0_4_ = iVar3;
      }
      if (*(long *)((long)pvVar1 + -0x10) == 0) {
        do {
          if ((int)n == 1) {
            msg._48_8_ = write((stream->io_watcher).fd,__iovec->iov_base,__iovec->iov_len);
          }
          else {
            msg._48_8_ = writev((stream->io_watcher).fd,__iovec,(int)n);
          }
          bVar6 = false;
          if (msg._48_8_ == -1) {
            piVar4 = __errno_location();
            bVar6 = *piVar4 == 4;
          }
        } while (bVar6);
      }
      else {
        scratch._60_4_ = uv__handle_fd(*(uv_handle_t **)((long)pvVar1 + -0x10));
        memset(&pv,0,0x40);
        if ((int)scratch._60_4_ < 0) {
          __assert_fail("fd_to_send >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x31b,"void uv__write(uv_stream_t *)");
        }
        cmsg = (cmsghdr *)0x0;
        msg.msg_name._0_4_ = 0;
        msg.msg_iov = (iovec *)(long)(int)n;
        msg.msg_controllen._0_4_ = 0;
        ppvStack_78 = &pv;
        msg.msg_control = (void *)0x18;
        scratch.alias.cmsg_len._0_4_ = 1;
        scratch.alias.cmsg_len._4_4_ = 1;
        pv = (void *)0x14;
        scratch.alias.cmsg_level = scratch._60_4_;
        msg._8_8_ = __iovec;
        msg.msg_iovlen = (size_t)ppvStack_78;
        do {
          msg._48_8_ = sendmsg((stream->io_watcher).fd,(msghdr *)&cmsg,0);
          bVar6 = false;
          if (msg._48_8_ == -1) {
            piVar4 = __errno_location();
            bVar6 = *piVar4 == 4;
          }
        } while (bVar6);
      }
      if ((long)msg._48_8_ < 0) break;
      while( true ) {
        if ((long)msg._48_8_ < 0) goto LAB_00a115af;
        plVar5 = (long *)(*(long *)((long)pvVar1 + 0x18) +
                         (ulong)*(uint *)((long)pvVar1 + 0x10) * 0x10);
        uVar2 = plVar5[1];
        if (*(uint *)((long)pvVar1 + 0x20) <= *(uint *)((long)pvVar1 + 0x10)) {
          __assert_fail("req->write_index < req->nbufs",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x36a,"void uv__write(uv_stream_t *)");
        }
        if ((ulong)msg._48_8_ < uVar2) break;
        *(int *)((long)pvVar1 + 0x10) = *(int *)((long)pvVar1 + 0x10) + 1;
        if ((ulong)msg._48_8_ < uVar2) {
          __assert_fail("(size_t)n >= len",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x382,"void uv__write(uv_stream_t *)");
        }
        msg._48_8_ = msg._48_8_ - uVar2;
        if (stream->write_queue_size < uVar2) {
          __assert_fail("stream->write_queue_size >= len",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x385,"void uv__write(uv_stream_t *)");
        }
        stream->write_queue_size = stream->write_queue_size - uVar2;
        if (*(int *)((long)pvVar1 + 0x10) == *(int *)((long)pvVar1 + 0x20)) {
          if (msg._48_8_ == 0) {
            uv__write_req_finish((uv_write_t *)((long)pvVar1 + -0x58));
            return;
          }
          __assert_fail("n == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x38a,"void uv__write(uv_stream_t *)");
        }
      }
      *plVar5 = msg._48_8_ + *plVar5;
      plVar5[1] = plVar5[1] - msg._48_8_;
      stream->write_queue_size = stream->write_queue_size - msg._48_8_;
      msg.msg_flags = 0;
      msg._52_4_ = 0;
      if ((stream->flags & 0x80) == 0) goto LAB_00a115af;
    }
    piVar4 = __errno_location();
    if ((*piVar4 != 0xb) && (piVar4 = __errno_location(), *piVar4 != 0xb)) {
      piVar4 = __errno_location();
      *(int *)((long)pvVar1 + 0x24) = -*piVar4;
      uv__write_req_finish((uv_write_t *)((long)pvVar1 + -0x58));
      uv__io_stop(stream->loop,&stream->io_watcher,4);
      iVar3 = uv__io_active(&stream->io_watcher,1);
      if ((iVar3 == 0) &&
         (((stream->flags & 0x4000) != 0 &&
          (stream->flags = stream->flags & 0xffffbfff, (stream->flags & 0x2000) != 0)))) {
        stream->loop->active_handles = stream->loop->active_handles - 1;
      }
      uv__stream_osx_interrupt_select(stream);
      return;
    }
  } while ((stream->flags & 0x80) != 0);
LAB_00a115af:
  if ((msg._48_8_ != 0) && (msg._48_8_ != -1)) {
    __assert_fail("n == 0 || n == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x394,"void uv__write(uv_stream_t *)");
  }
  if ((stream->flags & 0x80) == 0) {
    uv__io_start(stream->loop,&stream->io_watcher,4);
    uv__stream_osx_interrupt_select(stream);
    return;
  }
  __assert_fail("!(stream->flags & UV_STREAM_BLOCKING)",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                ,0x397,"void uv__write(uv_stream_t *)");
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  struct iovec* iov;
  QUEUE* q;
  uv_write_t* req;
  int iovmax;
  int iovcnt;
  ssize_t n;

start:

  assert(uv__stream_fd(stream) >= 0);

  if (QUEUE_EMPTY(&stream->write_queue))
    return;

  q = QUEUE_HEAD(&stream->write_queue);
  req = QUEUE_DATA(q, uv_write_t, queue);
  assert(req->handle == stream);

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  assert(sizeof(uv_buf_t) == sizeof(struct iovec));
  iov = (struct iovec*) &(req->bufs[req->write_index]);
  iovcnt = req->nbufs - req->write_index;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */

  if (req->send_handle) {
    struct msghdr msg;
    struct cmsghdr *cmsg;
    int fd_to_send = uv__handle_fd((uv_handle_t*) req->send_handle);
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do {
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    }
#if defined(__APPLE__)
    /*
     * Due to a possible kernel bug at least in OS X 10.10 "Yosemite",
     * EPROTOTYPE can be returned while trying to write to a socket that is
     * shutting down. If we retry the write, we should get the expected EPIPE
     * instead.
     */
    while (n == -1 && (errno == EINTR || errno == EPROTOTYPE));
#else
    while (n == -1 && errno == EINTR);
#endif
  } else {
    do {
      if (iovcnt == 1) {
        n = write(uv__stream_fd(stream), iov[0].iov_base, iov[0].iov_len);
      } else {
        n = writev(uv__stream_fd(stream), iov, iovcnt);
      }
    }
#if defined(__APPLE__)
    /*
     * Due to a possible kernel bug at least in OS X 10.10 "Yosemite",
     * EPROTOTYPE can be returned while trying to write to a socket that is
     * shutting down. If we retry the write, we should get the expected EPIPE
     * instead.
     */
    while (n == -1 && (errno == EINTR || errno == EPROTOTYPE));
#else
    while (n == -1 && errno == EINTR);
#endif
  }

  if (n < 0) {
    if (errno != EAGAIN && errno != EWOULDBLOCK) {
      /* Error */
      req->error = -errno;
      uv__write_req_finish(req);
      uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
      if (!uv__io_active(&stream->io_watcher, POLLIN))
        uv__handle_stop(stream);
      uv__stream_osx_interrupt_select(stream);
      return;
    } else if (stream->flags & UV_STREAM_BLOCKING) {
      /* If this is a blocking stream, try again. */
      goto start;
    }
  } else {
    /* Successful write */

    while (n >= 0) {
      uv_buf_t* buf = &(req->bufs[req->write_index]);
      size_t len = buf->len;

      assert(req->write_index < req->nbufs);

      if ((size_t)n < len) {
        buf->base += n;
        buf->len -= n;
        stream->write_queue_size -= n;
        n = 0;

        /* There is more to write. */
        if (stream->flags & UV_STREAM_BLOCKING) {
          /*
           * If we're blocking then we should not be enabling the write
           * watcher - instead we need to try again.
           */
          goto start;
        } else {
          /* Break loop and ensure the watcher is pending. */
          break;
        }

      } else {
        /* Finished writing the buf at index req->write_index. */
        req->write_index++;

        assert((size_t)n >= len);
        n -= len;

        assert(stream->write_queue_size >= len);
        stream->write_queue_size -= len;

        if (req->write_index == req->nbufs) {
          /* Then we're done! */
          assert(n == 0);
          uv__write_req_finish(req);
          /* TODO: start trying to write the next request. */
          return;
        }
      }
    }
  }

  /* Either we've counted n down to zero or we've got EAGAIN. */
  assert(n == 0 || n == -1);

  /* Only non-blocking streams should use the write_watcher. */
  assert(!(stream->flags & UV_STREAM_BLOCKING));

  /* We're not done. */
  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

  /* Notify select() thread about state change */
  uv__stream_osx_interrupt_select(stream);
}